

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PotDiff.cpp
# Opt level: O2

void __thiscall OpenMD::PotDiff::writeDiff(PotDiff *this)

{
  char cVar1;
  ostream *poVar2;
  uint uVar3;
  ulong uVar4;
  RealType RVar5;
  double dVar6;
  double dVar7;
  ofstream ofs;
  
  std::ofstream::ofstream(&ofs,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_bin)
  ;
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    snprintf(painCave.errMsg,2000,"PotDiff: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    dVar6 = (this->data_).Avg_;
    dVar7 = (this->data_).Avg2_;
    RVar5 = Utils::Accumulator<double>::get95percentConfidenceInterval(&this->data_);
    std::operator<<((ostream *)&ofs,"#potDiff\n");
    poVar2 = std::operator<<((ostream *)&ofs,"#selection: (");
    poVar2 = std::operator<<(poVar2,(string *)&this->selectionScript_);
    std::operator<<(poVar2,")\n");
    std::operator<<((ostream *)&ofs,"# <diff> = ");
    poVar2 = std::ostream::_M_insert<double>(dVar6);
    std::operator<<(poVar2,"\n");
    std::operator<<((ostream *)&ofs,"# StdDev = ");
    dVar7 = dVar7 - dVar6 * dVar6;
    dVar6 = 0.0;
    if (0.0 <= dVar7) {
      dVar6 = dVar7;
    }
    poVar2 = std::ostream::_M_insert<double>(SQRT(dVar6));
    std::operator<<(poVar2,"\n");
    std::operator<<((ostream *)&ofs,"# 95% confidence interval = ");
    poVar2 = std::ostream::_M_insert<double>(RVar5);
    std::operator<<(poVar2,"\n");
    std::operator<<((ostream *)&ofs,"# t\tdiff[t]\n");
    for (uVar3 = 0; uVar4 = (ulong)uVar3,
        uVar4 < (ulong)((long)(this->diff_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->diff_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
      poVar2 = std::ostream::_M_insert<double>
                         ((this->times_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start[uVar4]);
      std::operator<<(poVar2,"\t");
      poVar2 = std::ostream::_M_insert<double>
                         ((this->diff_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4]);
      std::operator<<(poVar2,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void PotDiff::writeDiff() {
    std::ofstream ofs(outputFilename_.c_str(), std::ios::binary);
    if (ofs.is_open()) {
      RealType mu    = data_.getAverage();
      RealType sigma = data_.getStdDev();
      RealType m95   = data_.get95percentConfidenceInterval();

      ofs << "#potDiff\n";
      ofs << "#selection: (" << selectionScript_ << ")\n";
      ofs << "# <diff> = " << mu << "\n";
      ofs << "# StdDev = " << sigma << "\n";
      ofs << "# 95% confidence interval = " << m95 << "\n";
      ofs << "# t\tdiff[t]\n";
      for (unsigned int i = 0; i < diff_.size(); ++i) {
        ofs << times_[i] << "\t" << diff_[i] << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "PotDiff: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
    ofs.close();
  }